

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionPair::ChCollisionPair
          (ChCollisionPair *this,ChGeometry *mgeo1,ChGeometry *mgeo2)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  
  *(undefined8 *)((long)(this->p2).m_data + 4) = 0;
  *(undefined8 *)((long)(this->p2).m_data + 0xc) = 0;
  *(undefined8 *)((long)(this->p2).m_data + 0x14) = 0;
  (this->normal).m_data[1] = 0.0;
  (this->normal).m_data[2] = 0.0;
  (this->p1).m_data[0] = 0.0;
  (this->p1).m_data[1] = 0.0;
  (this->p1).m_data[2] = 0.0;
  (this->p2).m_data[0] = 0.0;
  this->geo1 = mgeo1;
  this->geo2 = mgeo2;
  auVar2 = _VNULL;
  if (this == (ChCollisionPair *)Q_FLIP_AROUND_Z) {
    auVar2 = ZEXT416(0) << 0x40;
    dVar3 = 0.0;
  }
  else {
    *(undefined1 (*) [16])(this->p2).m_data = _VNULL;
    dVar3 = DAT_011dd3e8;
    (this->p2).m_data[2] = DAT_011dd3e8;
  }
  *(undefined1 (*) [16])(this->p1).m_data = auVar2;
  (this->p1).m_data[2] = dVar3;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  *(undefined8 *)(this->normal).m_data = uVar1;
  (this->normal).m_data[2] = 0.0;
  this->norm_dist = 0.0;
  this->just_intersection = true;
  return;
}

Assistant:

inline ChVector<Real>::ChVector() {
    m_data[0] = 0;
    m_data[1] = 0;
    m_data[2] = 0;
}